

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  memory_resource *pmVar6;
  double *pdVar7;
  double *pdVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  Tuple2<pbrt::Point2,_int> TVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  int iVar12;
  undefined4 extraout_var;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Bounds2<int> tmp;
  
  pmVar6 = (this->allocator).memoryResource;
  if (pmVar6 == (other->allocator).memoryResource) {
    TVar9 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar10 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar11 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar11;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar9;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar10;
    pdVar7 = this->values;
    this->values = other->values;
    other->values = pdVar7;
  }
  else {
    iVar12 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar2 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar3 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar1 == iVar3 && iVar12 == iVar2) {
      iVar4 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar16 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar14 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      if (iVar16 == iVar5 && iVar4 == iVar14) {
        uVar15 = (iVar5 - iVar1) * (iVar4 - iVar12);
        if (0 < (int)uVar15) {
          pdVar7 = this->values;
          pdVar8 = other->values;
          uVar13 = 0;
          do {
            pdVar7[uVar13] = pdVar8[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
        }
        TVar9 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
             (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar9;
        return this;
      }
    }
    else {
      iVar14 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar16 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    (*pmVar6->_vptr_memory_resource[3])
              (pmVar6,this->values,(long)((iVar14 - iVar2) * (iVar16 - iVar3)) << 3,8);
    pmVar6 = (this->allocator).memoryResource;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    auVar18 = vpsubd_avx(auVar17,auVar18);
    auVar17 = vpshufd_avx(auVar18,0x55);
    auVar17 = vpmulld_avx(auVar17,auVar18);
    uVar15 = auVar17._0_4_;
    iVar12 = (*pmVar6->_vptr_memory_resource[2])(pmVar6,(long)(int)uVar15 * 8,8);
    this->values = (double *)CONCAT44(extraout_var,iVar12);
    if (0 < (int)uVar15) {
      pdVar7 = other->values;
      uVar13 = 0;
      do {
        ((double *)CONCAT44(extraout_var,iVar12))[uVar13] = pdVar7[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }